

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

IdentifierLookupResult *
anon_unknown.dwarf_9c70f::LookupObjectByName(ExpressionContext *ctx,uint nameHash)

{
  int iVar1;
  ScopeData *pSVar2;
  long *plVar3;
  Node *start;
  Node *pNVar4;
  Node *pNVar5;
  NodeIterator NVar6;
  
  pSVar2 = ctx->scope;
  do {
    if (pSVar2 == (ScopeData *)0x0) {
      return (IdentifierLookupResult *)0x0;
    }
    NVar6 = DirectChainedMap<IdentifierLookupResult>::first(&pSVar2->idLookupMap,nameHash);
    pNVar4 = NVar6.node;
    if (pNVar4 != (Node *)0x0) {
      if ((ctx->lookupLocation == (SynBase *)0x0) || (pSVar2->unrestricted != false)) {
LAB_00175cd9:
        return (IdentifierLookupResult *)(pNVar4 + 8);
      }
      while( true ) {
        plVar3 = *(long **)(pNVar4 + 8);
        if ((plVar3 == (long *)0x0) ||
           ((plVar3[1] != 0 || (*(char **)(*plVar3 + 0x20) <= (ctx->lookupLocation->pos).begin))))
        goto LAB_00175cd9;
        pNVar5 = *(Node **)(pNVar4 + 0x18);
        if (pNVar5 == NVar6.start) break;
        iVar1 = *(int *)pNVar4;
        while( true ) {
          if (pNVar5 == (Node *)0x0) goto LAB_00175ccd;
          pNVar4 = pNVar5;
          if (*(int *)pNVar5 == iVar1) break;
          pNVar5 = *(Node **)(pNVar5 + 0x18);
          if (pNVar5 == NVar6.start) goto LAB_00175ccd;
        }
      }
    }
LAB_00175ccd:
    pSVar2 = pSVar2->scope;
  } while( true );
}

Assistant:

IdentifierLookupResult* LookupObjectByName(ExpressionContext &ctx, unsigned nameHash)
	{
		typedef DirectChainedMap<IdentifierLookupResult>::NodeIterator Node;

		ScopeData *scope = ctx.scope;

		while(scope)
		{
			if(Node lookup = scope->idLookupMap.first(nameHash))
			{
				if(ctx.lookupLocation && !scope->unrestricted)
				{
					VariableData *variable = lookup.node->value.variable;

					// Skip variables that are not visible from current point
					while(variable && !variable->importModule && variable->source->pos.begin > ctx.lookupLocation->pos.begin)
					{
						lookup = scope->idLookupMap.next(lookup);

						if(lookup.node)
							variable = lookup.node->value.variable;
						else
							variable = NULL;
					}
				}

				if(lookup.node)
					return &lookup.node->value;;
			}

			scope = scope->scope;
		}

		return NULL;
	}